

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O0

void assert_parse_string(char *string,char *expected)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *expected_local;
  char *string_local;
  parse_buffer buffer;
  
  buffer.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(&string_local,0,0x38);
  string_local = string;
  sVar2 = strlen(string);
  buffer.content = (uchar *)(sVar2 + 1);
  buffer.depth = (size_t)global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  cVar1 = parse_string(item,(parse_buffer *)&string_local);
  if (cVar1 == 0) {
    UnityFail("Couldn\'t parse string.",0x35);
  }
  assert_is_string(item);
  UnityAssertEqualString(expected,item[0].valuestring,"The parsed result isn\'t as expected.",0x37);
  (*global_hooks.deallocate)(item[0].valuestring);
  item[0].valuestring = (char *)0x0;
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != buffer.hooks.reallocate) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_parse_string(const char *string, const char *expected)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE_MESSAGE(parse_string(item, &buffer), "Couldn't parse string.");
    assert_is_string(item);
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, item->valuestring, "The parsed result isn't as expected.");
    global_hooks.deallocate(item->valuestring);
    item->valuestring = NULL;
}